

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O3

int fits_calc_binningde(fitsfile *fptr,int naxis,char (*colname) [71],char **colexpr,double *minin,
                       double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
                       char (*binname) [71],int *colnum,int *datatypes,long *haxes,double *amin,
                       double *amax,double *binsize,long *repeat,int *status)

{
  char *pcVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  char (*keyname_00) [71];
  long lVar7;
  char *pcVar8;
  int *piVar9;
  char *__dest;
  int *unaff_R14;
  char cVar10;
  int *piVar11;
  char *__dest_00;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  char (*local_3b0) [71];
  int datatype;
  int tstatus;
  int *local_398;
  char (*local_390) [71];
  ulong local_388;
  char (*local_380) [71];
  double datamax;
  long repeat1;
  undefined4 local_364;
  long local_360;
  double *local_358;
  char (*local_350) [71];
  long nelem;
  double datamin;
  void *local_338;
  long local_330;
  double *local_328;
  int naxis_1;
  char errmsg [81];
  char keyname [75];
  long naxes [5];
  char cpref [4] [71];
  ParseData lParse;
  
  iVar4 = *status;
  if (iVar4 < 1) {
    if (repeat != (long *)0x0) {
      *repeat = 0;
    }
    if (naxis < 5) {
      local_358 = minin;
      local_328 = maxin;
      if (fptr->HDUposition != fptr->Fptr->curhdu) {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      local_350 = cpref;
      cpref[0][0] = '\0';
      cpref[1][0] = '\0';
      cpref[2][0] = '\0';
      cpref[3][0] = '\0';
      tstatus = 0;
      ffgky(fptr,0x10,"CPREF",local_350,(char *)0x0,&tstatus);
      if (tstatus == 0) {
        __dest = cpref[1];
        __dest_00 = cpref[2];
        pcVar8 = cpref[0];
LAB_001c0daa:
        if (*pcVar8 == '\0') goto LAB_001c0477;
        if (*pcVar8 != ',') goto code_r0x001c0dba;
        *pcVar8 = '\0';
        do {
          pcVar1 = pcVar8 + 1;
          pcVar8 = pcVar8 + 1;
        } while (*pcVar1 == ' ');
        strcpy(__dest,pcVar8);
LAB_001c0dd4:
        if (*__dest != '\0') {
          if (*__dest != ',') goto code_r0x001c0de6;
          *__dest = '\0';
          do {
            pcVar8 = __dest + 1;
            __dest = __dest + 1;
          } while (*pcVar8 == ' ');
          strcpy(__dest_00,__dest);
          while( true ) {
            if (*__dest_00 == '\0') goto LAB_001c0477;
            if (*__dest_00 == ',') break;
            __dest_00 = __dest_00 + 1;
          }
          *__dest_00 = '\0';
          do {
            pcVar8 = __dest_00 + 1;
            __dest_00 = __dest_00 + 1;
          } while (*pcVar8 == ' ');
          strcpy(cpref[3],__dest_00);
        }
      }
LAB_001c0477:
      if (0 < naxis) {
        local_380 = minname;
        local_330 = (ulong)(uint)naxis << 3;
        local_360 = 0;
        lVar7 = 0;
        local_388 = 0;
        bVar3 = false;
        piVar9 = colnum;
        local_3b0 = colname;
        do {
          local_390 = binname;
          if ((*local_3b0)[0] == '\0') {
            if (((colexpr == (char **)0x0) ||
                (pcVar8 = *(char **)((long)colexpr + lVar7), pcVar8 == (char *)0x0)) ||
               (*pcVar8 == '\0')) {
              strcpy(*local_3b0,*local_350);
              if (local_388 < 4 && (*local_3b0)[0] == '\0') {
                *(short *)*local_3b0 = (short)(0x54005a00590058 >> ((byte)local_360 & 0x3f));
              }
              goto LAB_001c04e2;
            }
            piVar11 = colnum + local_388;
            *piVar9 = 0;
LAB_001c054c:
            if (*pcVar8 == '\0') {
              unaff_R14 = (int *)0x0;
              goto LAB_001c0630;
            }
            local_398 = piVar11;
            iVar4 = ffiprs(fptr,0,pcVar8,5,&datatype,&nelem,&naxis_1,naxes,&lParse,status);
            if (iVar4 == 0) {
              if (nelem < 0) {
                nelem = 1;
              }
              repeat1 = nelem;
              ffcprs(&lParse);
              uVar12 = 0;
              goto LAB_001c0679;
            }
            maxname = (char (*) [71])errmsg;
            snprintf((char *)maxname,0x51,"Parser error of binning expression: %s",
                     *(undefined8 *)((long)colexpr + lVar7));
LAB_001c0f91:
            ffpmsg(*maxname);
            break;
          }
LAB_001c04e2:
          *piVar9 = 0;
          piVar11 = piVar9;
          if (colexpr == (char **)0x0) {
            unaff_R14 = (int *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
          }
          else {
            pcVar8 = *(char **)((long)colexpr + lVar7);
            if (pcVar8 != (char *)0x0) goto LAB_001c054c;
            unaff_R14 = (int *)0x0;
          }
LAB_001c0630:
          iVar4 = ffgcno(fptr,0,*local_3b0,piVar11,status);
          if (0 < iVar4) {
            builtin_strncpy(errmsg + 0x20,"t exist: ",10);
            builtin_strncpy(errmsg + 0x10,"gram axis doesn\'",0x10);
            builtin_strncpy(errmsg,"column for histo",0x10);
LAB_001c0ec9:
            maxname = (char (*) [71])errmsg;
            sVar6 = strlen((char *)maxname);
            strncat((char *)maxname,*local_3b0,0x50 - sVar6);
            goto LAB_001c0f91;
          }
          local_398 = piVar11;
          ffeqty(fptr,*piVar11,&datatype,&repeat1,(long *)0x0,status);
          uVar12 = SUB84(unaff_R14,0);
LAB_001c0679:
          pdVar2 = local_358;
          if ((datatype < 0) || (datatype == 0x10)) {
            builtin_strncpy(errmsg + 0x20,"n this column: ",0x10);
            builtin_strncpy(errmsg + 0x10,"tatype; can\'t bi",0x10);
            builtin_strncpy(errmsg,"Inappropriate da",0x10);
            sVar6 = strlen(errmsg);
            strncat(errmsg,*local_3b0,0x50 - sVar6);
            ffpmsg(errmsg);
            *status = 0x19a;
            return 0x19a;
          }
          if (repeat != (long *)0x0) {
            if (lVar7 == 0) {
              *repeat = repeat1;
            }
            else if (*repeat != repeat1) {
              pcVar8 = errmsg;
              builtin_strncpy(errmsg + 0x20,"o not agree",0xc);
              errmsg[0x10] = ' ';
              errmsg[0x11] = 'i';
              errmsg[0x12] = 'n';
              errmsg[0x13] = 'p';
              errmsg[0x14] = 'u';
              errmsg[0x15] = 't';
              errmsg[0x16] = ' ';
              errmsg[0x17] = 'c';
              builtin_strncpy(errmsg + 0x18,"olumns d",8);
              errmsg[0] = 'V';
              errmsg[1] = 'e';
              errmsg[2] = 'c';
              errmsg[3] = 't';
              errmsg[4] = 'o';
              errmsg[5] = 'r';
              errmsg[6] = ' ';
              errmsg[7] = 'r';
              errmsg[8] = 'e';
              errmsg[9] = 'p';
              errmsg[10] = 'e';
              errmsg[0xb] = 'a';
              errmsg[0xc] = 't';
              errmsg[0xd] = ' ';
              errmsg[0xe] = 'o';
              errmsg[0xf] = 'f';
              goto LAB_001c03e1;
            }
          }
          if (datatypes != (int *)0x0) {
            datatypes[local_388] = datatype;
          }
          datamin = -9.1191291391491e-36;
          datamax = -9.1191291391491e-36;
          if (((*local_380)[0] != '\0') &&
             (iVar4 = ffgky(fptr,0x52,*local_380,(void *)((long)local_358 + lVar7),(char *)0x0,
                            status), iVar4 != 0)) {
            ffpmsg("error reading histogramming minimum keyword");
            maxname = local_380;
            goto LAB_001c0f91;
          }
          dVar16 = *(double *)((long)pdVar2 + lVar7);
          cVar10 = (char)uVar12;
          if ((dVar16 == -9.1191291391491e-36) && (!NAN(dVar16))) {
            if (((cVar10 != '\0') ||
                (pcVar8 = *(char **)((long)colexpr + lVar7), pcVar8 == (char *)0x0)) ||
               (*pcVar8 == '\0')) {
              ffkeyn("TLMIN",*local_398,keyname,status);
              iVar4 = ffgky(fptr,0x52,keyname,(double *)((long)amin + lVar7),(char *)0x0,status);
              if (0 < iVar4) {
                *status = 0;
                iVar4 = fits_get_col_minmax(fptr,*local_398,(double *)((long)amin + lVar7),&datamax,
                                            status);
                if (0 < iVar4) {
                  pcVar8 = errmsg;
                  builtin_strncpy(errmsg,"Error calculating datamin and datamax for column: ",0x33);
                  sVar6 = strlen(pcVar8);
                  strncat(pcVar8,*local_3b0,0x50 - sVar6);
                  goto LAB_001c1041;
                }
              }
              goto LAB_001c0824;
            }
            pdVar2 = (double *)((long)amin + lVar7);
            iVar4 = fits_get_expr_minmax(fptr,pcVar8,pdVar2,&datamax,(int *)0x0,status);
            if (iVar4 < 1) {
              if ((*pdVar2 == -9.1191291391491e-36) && (!NAN(*pdVar2))) {
                *pdVar2 = 0.0;
              }
              goto LAB_001c0824;
            }
LAB_001c0ffd:
            builtin_strncpy(errmsg,"Error calculating datamin and datamax for expression: ",0x37);
            ffpmsg(errmsg);
            pcVar8 = *(char **)((long)colexpr + lVar7);
LAB_001c1041:
            ffpmsg(pcVar8);
            return *status;
          }
          *(double *)((long)amin + lVar7) = dVar16;
LAB_001c0824:
          pdVar2 = local_328;
          if (((*maxname)[0] != '\0') &&
             (iVar4 = ffgky(fptr,0x52,*maxname,(void *)((long)local_328 + lVar7),(char *)0x0,status)
             , iVar4 != 0)) {
            pcVar8 = "error reading histogramming maximum keyword";
LAB_001c0f14:
            ffpmsg(pcVar8);
            goto LAB_001c0f91;
          }
          dVar16 = *(double *)((long)pdVar2 + lVar7);
          if ((dVar16 != -9.1191291391491e-36) || (NAN(dVar16))) {
            *(double *)((long)amax + lVar7) = dVar16;
            keyname_00 = local_390;
          }
          else {
            if (((cVar10 == '\0') &&
                (pcVar8 = *(char **)((long)colexpr + lVar7), pcVar8 != (char *)0x0)) &&
               (*pcVar8 != '\0')) {
              iVar4 = fits_get_expr_minmax
                                (fptr,pcVar8,&datamin,(double *)((long)amax + lVar7),(int *)0x0,
                                 status);
              if (0 < iVar4) goto LAB_001c0ffd;
              dVar16 = *(double *)((long)amax + lVar7);
              if ((dVar16 == -9.1191291391491e-36) && (!NAN(dVar16))) {
                *(undefined8 *)((long)amin + lVar7) = 0x3ff0000000000000;
              }
            }
            else {
              ffkeyn("TLMAX",*local_398,keyname,status);
              pdVar2 = (double *)((long)amax + lVar7);
              iVar4 = ffgky(fptr,0x52,keyname,pdVar2,(char *)0x0,status);
              keyname_00 = local_390;
              bVar3 = true;
              unaff_R14 = status;
              if (0 < iVar4) {
                *status = 0;
                if ((datamax != -9.1191291391491e-36) || (NAN(datamax))) {
                  *pdVar2 = datamax;
                }
                else {
                  iVar4 = fits_get_col_minmax(fptr,*local_398,&datamin,pdVar2,status);
                  if (0 < iVar4) {
                    builtin_strncpy(errmsg,"Error calculating datamin and datamax for column: ",0x33
                                   );
                    goto LAB_001c0ec9;
                  }
                }
                goto LAB_001c09bb;
              }
            }
            bVar3 = true;
            keyname_00 = local_390;
          }
LAB_001c09bb:
          if (((*keyname_00)[0] != '\0') &&
             (iVar4 = ffgky(fptr,0x52,*keyname_00,(void *)((long)binsizein + lVar7),(char *)0x0,
                            status), iVar4 != 0)) {
            pcVar8 = "error reading histogramming binsize keyword";
            maxname = keyname_00;
            goto LAB_001c0f14;
          }
          dVar16 = *(double *)((long)binsizein + lVar7);
          if ((dVar16 == 0.0) && (!NAN(dVar16))) {
            ffpmsg("error: histogram binsize = 0");
            *status = 0x142;
            return 0x142;
          }
          if ((dVar16 != -9.1191291391491e-36) || (NAN(dVar16))) {
            *(double *)((long)binsize + lVar7) = dVar16;
          }
          else {
            tstatus = 0;
            local_364 = uVar12;
            if (((cVar10 != '\0') || (*(char **)((long)colexpr + lVar7) == (char *)0x0)) ||
               (**(char **)((long)colexpr + lVar7) == '\0')) {
              local_338 = (void *)((long)binsizein + lVar7);
              unaff_R14 = &tstatus;
              ffkeyn("TDBIN",*local_398,keyname,unaff_R14);
              ffgky(fptr,0x52,keyname,local_338,(char *)0x0,unaff_R14);
              if ((tstatus == 0) &&
                 ((((char)local_364 != '\0' || (*(char **)((long)colexpr + lVar7) == (char *)0x0))
                  || (**(char **)((long)colexpr + lVar7) == '\0')))) goto LAB_001c0a22;
            }
            dVar16 = (*(double *)((long)amax + lVar7) - *(double *)((long)amin + lVar7)) / 10.0;
            *(double *)((long)binsize + lVar7) = dVar16;
            if (1.0 < dVar16) {
              *(undefined8 *)((long)binsize + lVar7) = 0x3ff0000000000000;
            }
          }
LAB_001c0a22:
          dVar16 = *(double *)((long)amin + lVar7);
          uVar12 = SUB84(dVar16,0);
          uVar13 = (undefined4)((ulong)dVar16 >> 0x20);
          dVar14 = *(double *)((long)amax + lVar7);
          if (((dVar14 < dVar16) && (dVar15 = *(double *)((long)binsize + lVar7), 0.0 < dVar15)) ||
             ((dVar15 = *(double *)((long)binsize + lVar7), dVar16 < dVar14 && (dVar15 < 0.0)))) {
            dVar15 = -dVar15;
            *(double *)((long)binsize + lVar7) = dVar15;
            uVar12 = (undefined4)*(undefined8 *)((long)amin + lVar7);
            uVar13 = (undefined4)((ulong)*(undefined8 *)((long)amin + lVar7) >> 0x20);
            dVar14 = *(double *)((long)amax + lVar7);
          }
          if (datatype < 0x2a) {
            if (((double)CONCAT44(uVar13,uVar12) != (double)(int)(double)CONCAT44(uVar13,uVar12)) ||
               (NAN((double)CONCAT44(uVar13,uVar12)) ||
                NAN((double)(int)(double)CONCAT44(uVar13,uVar12)))) goto LAB_001c0b32;
            if ((dVar14 != (double)(int)dVar14) || (NAN(dVar14) || NAN((double)(int)dVar14)))
            goto LAB_001c0b32;
            if ((dVar15 != (double)(int)dVar15) || (NAN(dVar15) || NAN((double)(int)dVar15)))
            goto LAB_001c0b32;
            *(long *)((long)haxes + lVar7) =
                 (long)(((int)dVar14 - (int)(double)CONCAT44(uVar13,uVar12)) / (int)dVar15 + 1);
            if (dVar14 < (double)CONCAT44(uVar13,uVar12) ||
                dVar14 == (double)CONCAT44(uVar13,uVar12)) {
              *(double *)((long)amin + lVar7) = (double)CONCAT44(uVar13,uVar12) + 0.5;
              dVar16 = *(double *)((long)amax + lVar7) + -0.5;
            }
            else {
              *(double *)((long)amin + lVar7) = (double)CONCAT44(uVar13,uVar12) + -0.5;
              dVar16 = *(double *)((long)amax + lVar7) + 0.5;
            }
            *(double *)((long)amax + lVar7) = dVar16;
            goto LAB_001c0ce0;
          }
LAB_001c0b32:
          dVar16 = (dVar14 - (double)CONCAT44(uVar13,uVar12)) / dVar15;
          if (bVar3) {
            lVar5 = (long)(dVar16 + 1.0);
LAB_001c0cdc:
            *(long *)((long)haxes + lVar7) = lVar5;
          }
          else {
            lVar5 = (long)dVar16;
            *(long *)((long)haxes + lVar7) = lVar5;
            dVar16 = (double)lVar5 * dVar15 + (double)CONCAT44(uVar13,uVar12);
            if (dVar14 < (double)CONCAT44(uVar13,uVar12) ||
                dVar14 == (double)CONCAT44(uVar13,uVar12)) {
              if (dVar14 < dVar16) goto LAB_001c0cd9;
            }
            else if (dVar16 < dVar14) {
LAB_001c0cd9:
              lVar5 = lVar5 + 1;
              goto LAB_001c0cdc;
            }
          }
LAB_001c0ce0:
          local_388 = local_388 + 1;
          lVar7 = lVar7 + 8;
          local_360 = local_360 + 0x10;
          binname = keyname_00 + 1;
          maxname = maxname + 1;
          local_380 = local_380 + 1;
          piVar9 = piVar9 + 1;
          local_350 = local_350 + 1;
          local_3b0 = local_3b0 + 1;
        } while (local_330 != lVar7);
      }
      iVar4 = *status;
    }
    else {
      pcVar8 = "histograms with more than 4 dimensions are not supported";
LAB_001c03e1:
      ffpmsg(pcVar8);
      *status = 0x140;
      iVar4 = 0x140;
    }
  }
  return iVar4;
code_r0x001c0dba:
  pcVar8 = pcVar8 + 1;
  goto LAB_001c0daa;
code_r0x001c0de6:
  __dest = __dest + 1;
  goto LAB_001c0dd4;
}

Assistant:

int fits_calc_binningde(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      char *colexpr[4],  /* I - optional column expression instead of name*/
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      int *datatypes,  /* O - datatypes of each output column */
      long *haxes,     /* O - number of bins in each histogram axis */
      double *amin,     /* O - lower bound of the histogram axes */
      double *amax,     /* O - upper bound of the histogram axes */
      double *binsize,  /* O - width of histogram bins/pixels on each axis */
      long *repeat,     /* O - vector repeat of input columns */
      int *status)
/*_
    Calculate the actual binning parameters, based on various user input
    options.

    Note: caller is responsible to free parsers[*] upon return using ffcprs()
*/
{
    tcolumn *colptr;
    char *cptr, cpref[4][FLEN_VALUE];
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD];
    int tstatus, ii;
    int datatype, imin, imax, ibin,  use_datamax = 0;
    long repeat1;
    double datamin, datamax;
    int ncols;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Initialize the number of iterator columns required */
    if (repeat)    (*repeat) = 0;

    if (naxis > 4)
    {
        ffpmsg("histograms with more than 4 dimensions are not supported");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);
    
    /* ============================================================= */
    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    *cpref[0] = '\0';
    *cpref[1] = '\0';
    *cpref[2] = '\0';
    *cpref[3] = '\0';

    tstatus = 0;
    ffgky(fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    /* ============================================================= */
    /* Main Loop for calculating parameters for each column          */

    for (ii = 0; ii < naxis; ii++)
    {

      /* =========================================================== */
      /* Determine column Number, based on, in order of priority,
         1  input column name, or
	 2  name given by CPREF keyword, or
	 3  assume X, Y, Z and T for the name
      */

      if (*colname[ii] == '\0' && 
	  (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0'))
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      colnum[ii] = 0;
      if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
	if (ffgcno(fptr, CASEINSEN, colname[ii], colnum+ii, status) > 0)
	  {
	    strcpy(errmsg, "column for histogram axis doesn't exist: ");
	    strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	    ffpmsg(errmsg);
	    return(*status);
	  }
	
	/* ================================================================ */
	/* check tha column is not a vector or a string                     */
	
	/* get the datatype of the column */
	fits_get_eqcoltype(fptr, colnum[ii], &datatype,
			   &repeat1, NULL, status);
	
	ncols = 1; /* Require only one iterator column, the actual column */

      } else { /* column expression: use parse to determine datatype and dimensions */

	long nelem, naxes[MAXDIMS];
	int naxis;
	ParseData lParse;

	/* Initialize the parser so that we can determine the datatype
	   of the returned type as well as the vector dimensions */
	if ( ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis,
		     naxes, &lParse, status ) ) {
	  snprintf(errmsg, FLEN_ERRMSG, 
		   "Parser error of binning expression: %s", 
		   colexpr[ii]);
	  ffpmsg(errmsg);
	  return *status;
	}
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	repeat1 = nelem;

	/* We require lParse.nCols columns to be read from input,
	   plus one for the Temporary calculator result */
	ncols = lParse.nCols + 1;
	ffcprs( &lParse );
      }

      /* Not sure why this repeat limitation is here -- CM
	 The iterator system can handle vector columns just fine
`       */
      if (datatype < 0 || datatype == TSTRING)
      {
	strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
	strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	ffpmsg(errmsg);
	return(*status = BAD_DATATYPE);
      }

      /* Store repeat value for future use */
      if (repeat) {
	if (ii == 0) {
	  *repeat = repeat1; /* First time around save the repeat value */

	} else if (*repeat != repeat1) { /* later dimensions, keep same dims */

	  strcpy(errmsg, "Vector repeat of input columns do not agree");
	  ffpmsg(errmsg);
	  return (*status = BAD_DIMEN);
	}
      }

      if (datatypes) datatypes[ii] = datatype;

      /* ================================================================ */
      /* get the minimum value */

      datamin = DOUBLENULLVALUE;
      datamax = DOUBLENULLVALUE;
      
      if (*minname[ii])
      {
         if (ffgky(fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (minin[ii] != DOUBLENULLVALUE)
      {
        amin[ii] = (double) minin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMIN", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(fptr, colnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      } else { /* it's an expression */
	if (fits_get_expr_minmax(fptr, colexpr[ii], amin+ii, &datamax, 0, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
                ffpmsg(errmsg);
		ffpmsg(colexpr[ii]);
                return(*status);
            }
	if (amin[ii] == DOUBLENULLVALUE) amin[ii] = 0.0;
	
      }

      /* ================================================================ */
      /* get the maximum value */

      if (*maxname[ii])
      {
         if (ffgky(fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (maxin[ii] != DOUBLENULLVALUE)
      {
        amax[ii] = (double) maxin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMAX", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(fptr, colnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */

      } else { /* it's an expression */

	if (fits_get_expr_minmax(fptr, colexpr[ii], &datamin, &amax[ii], 0, status) > 0)
	{
	  strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
	  ffpmsg(errmsg);
	  ffpmsg(colexpr[ii]);
	  return(*status);
	}
	if (amax[ii] == DOUBLENULLVALUE) amin[ii] = 1.0;
        use_datamax = 1;  
      }


      /* ================================================================ */
      /* determine binning size and range                                 */

      if (*binname[ii])
      {
         if (ffgky(fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] != DOUBLENULLVALUE)
      { 
         binsize[ii] = (double) binsizein[ii];
      }
      else
      {
         tstatus = 0;

	 if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
	 {
	   ffkeyn("TDBIN", colnum[ii], keyname, &tstatus);
	   ffgky(fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus);
	 }

         if (tstatus || 
	     colexpr && colexpr[ii] && colexpr[ii][0]) {
	    /* make at least 10 bins */
            binsize[ii] = (amax[ii] - amin[ii]) / 10.F ;
            if (binsize[ii] > 1.)
                binsize[ii] = 1.;  /* use default bin size */
         }
      }

      /* ================================================================ */
      /* if the min is greater than the max, make the binsize negative */
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          binsize[ii] =  -binsize[ii];  /* reverse the sign of binsize */


      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
                               (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        haxes[ii] = (long) (((amax[ii] - amin[ii]) / binsize[ii]) + 1.); 
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        haxes[ii] = (long) ((amax[ii] - amin[ii]) / binsize[ii]);

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

    return(*status);
}